

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O3

void bifcapture(bifcxdef *ctx,int argc)

{
  uchar uVar1;
  runcxdef *prVar2;
  mcmcxdef *memctx;
  ulong uVar3;
  mcmon objnum;
  uint uVar4;
  uchar *puVar5;
  runsdef *prVar6;
  int len;
  uint uVar7;
  errdef fr_;
  errdef local_168;
  
  prVar2 = ctx->bifcxrun;
  memctx = prVar2->runcxmem;
  uVar1 = prVar2->runcxsp[-1].runstyp;
  if (uVar1 == '\x01') {
    prVar6 = prVar2->runcxsp + -1;
    prVar2->runcxsp = prVar6;
    if (prVar6->runstyp != '\x01') {
      ctx->bifcxrun->runcxerr->errcxptr->erraac = 0;
      runsign(ctx->bifcxrun,0x3eb);
    }
    uVar3 = (ctx->bifcxrun->runcxsp->runsv).runsvnum;
    objnum = tiogetcapture(ctx->bifcxtio);
    uVar4 = tiocapturesize(ctx->bifcxtio);
    if (objnum == 0xffff) {
      runpnil(ctx->bifcxrun);
    }
    else {
      uVar7 = (uint)uVar3;
      if (uVar7 == 0) {
        tiocapture(ctx->bifcxtio,memctx,0);
        tioclrcapture(ctx->bifcxtio);
      }
      puVar5 = mcmlck(memctx,objnum);
      local_168.errcode = _setjmp((__jmp_buf_tag *)local_168.errbuf);
      if (local_168.errcode != 0) {
        ctx->bifcxerr->errcxptr = local_168.errprv;
        mcmunlck(memctx,objnum);
        errrse1(ctx->bifcxerr,&local_168);
      }
      len = uVar4 - uVar7;
      if (uVar4 < uVar7) {
        len = 0;
      }
      local_168.errprv = ctx->bifcxerr->errcxptr;
      ctx->bifcxerr->errcxptr = &local_168;
      runpstr(ctx->bifcxrun,(char *)(puVar5 + (uVar3 & 0xffffffff)),len,0);
      ctx->bifcxerr->errcxptr = local_168.errprv;
      mcmunlck(memctx,objnum);
    }
  }
  else {
    if (uVar1 != '\b') {
      prVar2->runcxerr->errcxptr->erraav[0].errastr = "outcapture";
      ctx->bifcxrun->runcxerr->errcxptr->erraac = 1;
      runsign(ctx->bifcxrun,0x3ff);
    }
    tiocapture(ctx->bifcxtio,memctx,1);
    uVar4 = tiocapturesize(ctx->bifcxtio);
    runpnum(ctx->bifcxrun,(ulong)uVar4);
  }
  return;
}

Assistant:

void bifcapture(bifcxdef *ctx, int argc)
{
    mcmcxdef *mcx = ctx->bifcxrun->runcxmem;
    mcmon     obj;
    uint      siz;
    uint      ofs;
    uchar    *p;

    /* get the capture on/off flag */
    bifcntargs(ctx, 1, argc);
    switch(runtostyp(ctx->bifcxrun))
    {
    case DAT_TRUE:
        /* turn on capturing */
        tiocapture(ctx->bifcxtio, mcx, TRUE);

        /*
         *   The return value is a status code used to restore the
         *   original status on the bracketing call to turn off output.
         *   The only status necessary is the current output size. 
         */
        siz = tiocapturesize(ctx->bifcxtio);
        runpnum(ctx->bifcxrun, (long)siz);
        break;

    case DAT_NUMBER:
        /* get the original offset */
        ofs = runpopnum(ctx->bifcxrun);

        /* get the capture object and size */
        obj = tiogetcapture(ctx->bifcxtio);
        siz = tiocapturesize(ctx->bifcxtio);
        if (obj == MCMONINV)
        {
            runpnil(ctx->bifcxrun);
            return;
        }

        /* turn off capturing and reset the buffer on the outermost call */
        if (ofs == 0)
        {
            tiocapture(ctx->bifcxtio, mcx, FALSE);
            tioclrcapture(ctx->bifcxtio);
        }

        /* lock the object */
        p = mcmlck(mcx, obj);

        /* include only the part that happened after the matching call */
        p += ofs;
        siz = (ofs > siz) ? 0 : siz - ofs;

        ERRBEGIN(ctx->bifcxerr)

        /* push the string onto the stack */
        runpstr(ctx->bifcxrun, (char *)p, siz, 0);
        
        ERRCLEAN(ctx->bifcxerr)
            /* done with the object - unlock it */
            mcmunlck(mcx, obj);
        ERRENDCLN(ctx->bifcxerr)

        /* done with the object - unlock it */
        mcmunlck(mcx, obj);
        break;

    default:
        runsig1(ctx->bifcxrun, ERR_INVTBIF, ERRTSTR, "outcapture");
    }
}